

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerBase.cpp
# Opt level: O2

void __thiscall helics::BrokerBase::~BrokerBase(BrokerBase *this)

{
  this->_vptr_BrokerBase = (_func_int **)&PTR__BrokerBase_00463c18;
  if (this->queueDisabled == false) {
    joinAllThreads(this);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &(this->prBuff).super___shared_ptr<helics::ProfilerBuffer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)&this->configString);
  std::__cxx11::string::~string((string *)&this->lastErrorString);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &(this->mLogManager).super___shared_ptr<helics::LogManager,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  gmlc::containers::
  BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>::
  ~BlockingPriorityQueue(&this->actionQueue);
  CLI::std::
  unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>::
  ~unique_ptr(&this->timeCoord);
  std::thread::~thread((thread *)&this->queueProcessingThread);
  std::__cxx11::string::~string((string *)&this->address);
  std::__cxx11::string::~string((string *)&this->brokerKey);
  std::__cxx11::string::~string((string *)&this->identifier);
  return;
}

Assistant:

BrokerBase::~BrokerBase()
{
    if (!queueDisabled) {
        try {
            joinAllThreads();
        }
        catch (...) {
            ;  // no exceptions in the destructor
        }
    }
}